

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_dup_keys(lyd_node *new_list,lyd_node *old_list,lys_node *skip_key,ly_ctx *log_ctx,
                int options)

{
  lys_node *plVar1;
  lys_node *plVar2;
  int iVar3;
  lyd_node *node;
  lyd_node *node_00;
  char *pcVar4;
  ulong uVar5;
  
  plVar1 = new_list->schema;
  iVar3 = 0;
  if (plVar1->nodetype == LYS_LIST) {
    node_00 = old_list->child;
    if (node_00 == (lyd_node *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if ((ushort)plVar1->padding[2] <= (ushort)uVar5) {
          return 0;
        }
        plVar2 = *(lys_node **)(*(long *)&plVar1[1].flags + uVar5 * 8);
        if (node_00->schema != plVar2) {
          pcVar4 = plVar2->name;
          goto LAB_0016e424;
        }
        if (node_00->schema != skip_key) {
          node = lyd_dup_to_ctx(node_00,options & 2,(ly_ctx *)0x0);
          if (node == (lyd_node *)0x0) {
            ly_log(log_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_keys");
            goto LAB_0016e439;
          }
          iVar3 = lyd_insert(new_list,node);
          if (iVar3 != 0) {
            lyd_free_internal_r(node,1);
            goto LAB_0016e439;
          }
        }
        node_00 = node_00->next;
        uVar5 = uVar5 + 1;
      } while (node_00 != (lyd_node *)0x0);
    }
    iVar3 = 0;
    if ((ushort)uVar5 < (ushort)plVar1->padding[2]) {
      pcVar4 = (char *)**(undefined8 **)(*(long *)&plVar1[1].flags + (uVar5 & 0xffff) * 8);
LAB_0016e424:
      ly_vlog(log_ctx,LYE_PATH_INKEY,LY_VLOG_LYD,new_list,pcVar4);
LAB_0016e439:
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

static int
lyd_dup_keys(struct lyd_node *new_list, const struct lyd_node *old_list, struct lys_node *skip_key,
        struct ly_ctx *log_ctx, int options)
{
    struct lys_node_list *slist;
    struct lyd_node *key, *key_dup;
    uint16_t i;

    if (new_list->schema->nodetype != LYS_LIST) {
        return 0;
    }

    slist = (struct lys_node_list *)new_list->schema;
    for (key = old_list->child, i = 0; key && (i < slist->keys_size); ++i, key = key->next) {
        if (key->schema != (struct lys_node *)slist->keys[i]) {
            LOGVAL(log_ctx, LYE_PATH_INKEY, LY_VLOG_LYD, new_list, slist->keys[i]->name);
            return -1;
        }
        if (key->schema == skip_key) {
            continue;
        }

        key_dup = lyd_dup(key, options & LYD_DUP_OPT_NO_ATTR);
        LY_CHECK_ERR_RETURN(!key_dup, LOGMEM(log_ctx), -1);

        if (lyd_insert(new_list, key_dup)) {
            lyd_free(key_dup);
            return -1;
        }
    }
    if (!key && (i < slist->keys_size)) {
        LOGVAL(log_ctx, LYE_PATH_INKEY, LY_VLOG_LYD, new_list, slist->keys[i]->name);
        return -1;
    }

    return 0;
}